

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::truncate
          (ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this,char *__file,
          __off_t __length)

{
  OutputDirective *pOVar1;
  OutputDirective *pOVar2;
  String *pSVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  OutputDirective *pOVar6;
  
  pOVar2 = this->ptr;
  pOVar1 = this->pos;
  while (pOVar6 = pOVar1, pOVar2 + (long)__file < pOVar6) {
    pOVar1 = pOVar6 + -1;
    this->pos = pOVar1;
    if ((pOVar6[-1].dir.ptr.isSet == true) &&
       (pSVar3 = pOVar6[-1].dir.ptr.field_1.value.parts.ptr, pSVar3 != (String *)0x0)) {
      sVar4 = pOVar6[-1].dir.ptr.field_1.value.parts.size_;
      pOVar6[-1].dir.ptr.field_1.value.parts.ptr = (String *)0x0;
      pOVar6[-1].dir.ptr.field_1.value.parts.size_ = 0;
      pAVar5 = pOVar6[-1].dir.ptr.field_1.value.parts.disposer;
      (**pAVar5->_vptr_ArrayDisposer)
                (pAVar5,pSVar3,0x18,sVar4,sVar4,ArrayDisposer::Dispose_<kj::String>::destruct);
      pOVar1 = this->pos;
    }
  }
  return (int)pOVar6;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }